

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# holoPlay.cpp
# Opt level: O0

string * __thiscall
vera::getLenticularFragShader_abi_cxx11_
          (string *__return_storage_ptr__,vera *this,size_t _versionNumber)

{
  allocator local_1a;
  undefined1 local_19;
  vera *local_18;
  size_t _versionNumber_local;
  string *rta;
  
  local_19 = 0;
  local_18 = this;
  _versionNumber_local = (size_t)__return_storage_ptr__;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)__return_storage_ptr__,"",&local_1a);
  std::allocator<char>::~allocator((allocator<char> *)&local_1a);
  if (local_18 < (vera *)0x82) {
    std::__cxx11::string::operator+=
              ((string *)__return_storage_ptr__,(string *)lenticular_frag_abi_cxx11_);
  }
  else if ((vera *)0x81 < local_18) {
    std::__cxx11::string::operator+=
              ((string *)__return_storage_ptr__,(string *)lenticular_frag_300_abi_cxx11_);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string getLenticularFragShader(size_t _versionNumber) {
    std::string rta = "";

    if (_versionNumber < 130)
        rta += lenticular_frag;
    else if (_versionNumber >= 130) 
        rta += lenticular_frag_300;

    return rta;
}